

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O0

void diy::
     Serialization<std::vector<diy::Point<float,_2U>,_std::allocator<diy::Point<float,_2U>_>_>_>::
     save(BinaryBuffer *bb,Vector *v)

{
  size_type sVar1;
  BinaryBuffer *bb_00;
  vector<diy::Point<float,_2U>,_std::allocator<diy::Point<float,_2U>_>_> *in_RSI;
  Point<float,_2U> *in_RDI;
  size_t s;
  unsigned_long *in_stack_ffffffffffffffd8;
  BinaryBuffer *in_stack_ffffffffffffffe0;
  
  sVar1 = Catch::clara::std::vector<diy::Point<float,_2U>,_std::allocator<diy::Point<float,_2U>_>_>
          ::size(in_RSI);
  save<unsigned_long>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (sVar1 != 0) {
    bb_00 = (BinaryBuffer *)
            Catch::clara::std::
            vector<diy::Point<float,_2U>,_std::allocator<diy::Point<float,_2U>_>_>::operator[]
                      (in_RSI,0);
    Catch::clara::std::vector<diy::Point<float,_2U>,_std::allocator<diy::Point<float,_2U>_>_>::size
              (in_RSI);
    save<diy::Point<float,2u>>(bb_00,in_RDI,0x19d24b);
  }
  return;
}

Assistant:

static void         save(BinaryBuffer& bb, const Vector& v)
    {
      size_t s = v.size();
      diy::save(bb, s);
      if (s > 0)
        diy::save(bb, &v[0], v.size());
    }